

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_linkedsectors.cpp
# Opt level: O2

bool P_AddSectorLinks(sector_t_conflict *control,int tag,INTBOOL ceiling,int movetype)

{
  bool bVar1;
  uint uVar2;
  uint uVar3;
  TArray<FLinkedSector,_FLinkedSector> *this;
  FSectorTagIterator itr;
  
  if (ceiling == 0) {
    bVar1 = sector_t::PlaneMoving((sector_t *)control,0);
    if (bVar1) {
      return false;
    }
  }
  else {
    bVar1 = sector_t::PlaneMoving((sector_t *)control,1);
    if (bVar1) {
      return false;
    }
  }
  uVar2 = (uint)((movetype & 5U) != 4) * 5 + 10 & movetype;
  uVar3 = uVar2 & 5;
  if ((movetype & 10U) != 8) {
    uVar3 = uVar2;
  }
  if ((movetype != 0) && (uVar3 == 0)) {
    return false;
  }
  this = &(&(control->e->Linked).Floor)[ceiling != 0].Sectors;
  if (uVar3 == 0) {
    uVar3 = (&(control->e->Linked).Floor)[ceiling != 0].Sectors.Count;
    while (uVar3 = uVar3 - 1, -1 < (int)uVar3) {
      bVar1 = FTagManager::SectorHasTag
                        (&tagManager,(sector_t *)this->Array[uVar3 & 0x7fffffff].Sector,tag);
      if (bVar1) {
        TArray<FLinkedSector,_FLinkedSector>::Delete(this,uVar3);
      }
    }
  }
  else {
    if (tag == 0) {
      itr.start = 0;
    }
    else {
      itr.start = tagManager.TagHashFirst[(ulong)(uint)tag & 0xff];
    }
    itr.searchtag = tag;
    while (uVar2 = FSectorTagIterator::Next(&itr), -1 < (int)uVar2) {
      if (sectors + uVar2 != control) {
        AddSingleSector((plane *)this,sectors + uVar2,uVar3);
      }
    }
  }
  return true;
}

Assistant:

bool P_AddSectorLinks(sector_t *control, int tag, INTBOOL ceiling, int movetype)
{
	int param = movetype;

	// can't be done if the control sector is moving.
	if ((ceiling && control->PlaneMoving(sector_t::ceiling)) || 
		(!ceiling && control->PlaneMoving(sector_t::floor))) return false;

	// Make sure we have only valid combinations
	movetype &= LINK_FLAGMASK;
	if ((movetype & LINK_FLOORMIRROR) == LINK_FLOORMIRRORFLAG) movetype &= ~LINK_FLOORMIRRORFLAG;
	if ((movetype & LINK_CEILINGMIRROR) == LINK_CEILINGMIRRORFLAG) movetype &= ~LINK_CEILINGMIRRORFLAG;

	// Don't remove any sector if the parameter is invalid.
	// Addition may still be performed based on the given value.
	if (param != 0 && movetype == 0) return false;

	extsector_t::linked::plane &scrollplane = ceiling? control->e->Linked.Ceiling : control->e->Linked.Floor;

	if (movetype > 0)
	{
		int sec;
		FSectorTagIterator itr(tag);
		while ((sec = itr.Next()) >= 0)
		{
			// Don't attach to self!
			if (control != &sectors[sec])
			{
				AddSingleSector(scrollplane, &sectors[sec], movetype);
			}
		}
	}
	else
	{
		RemoveTaggedSectors(scrollplane, tag);
	}
	return true;
}